

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> wabt::MakeUnique<wabt::Module>(void)

{
  void *__s;
  __uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true> in_RDI;
  
  __s = operator_new(0x370);
  memset(__s,0,0x360);
  *(long *)((long)__s + 0x20) = (long)__s + 0x30;
  *(undefined1 *)((long)__s + 0x30) = 0;
  *(undefined8 *)((long)__s + 0x40) = 0;
  *(undefined8 *)((long)__s + 0x48) = 0;
  *(undefined8 *)((long)__s + 0x50) = 0;
  *(undefined8 *)((long)__s + 0x58) = 0;
  *(undefined8 *)((long)__s + 0x5c) = 0;
  *(undefined8 *)((long)__s + 100) = 0;
  memset((void *)((long)__s + 0x70),0,0x108);
  *(long *)((long)__s + 0x178) = (long)__s + 0x1a8;
  *(undefined8 *)((long)__s + 0x180) = 1;
  *(undefined8 *)((long)__s + 0x188) = 0;
  *(undefined8 *)((long)__s + 400) = 0;
  *(undefined4 *)((long)__s + 0x198) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x1a0) = 0;
  *(undefined8 *)((long)__s + 0x1a8) = 0;
  *(long *)((long)__s + 0x1b0) = (long)__s + 0x1e0;
  *(undefined8 *)((long)__s + 0x1b8) = 1;
  *(undefined8 *)((long)__s + 0x1c0) = 0;
  *(undefined8 *)((long)__s + 0x1c8) = 0;
  *(undefined4 *)((long)__s + 0x1d0) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x1d8) = 0;
  *(undefined8 *)((long)__s + 0x1e0) = 0;
  *(long *)((long)__s + 0x1e8) = (long)__s + 0x218;
  *(undefined8 *)((long)__s + 0x1f0) = 1;
  *(undefined8 *)((long)__s + 0x1f8) = 0;
  *(undefined8 *)((long)__s + 0x200) = 0;
  *(undefined4 *)((long)__s + 0x208) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x210) = 0;
  *(undefined8 *)((long)__s + 0x218) = 0;
  *(long *)((long)__s + 0x220) = (long)__s + 0x250;
  *(undefined8 *)((long)__s + 0x228) = 1;
  *(undefined8 *)((long)__s + 0x230) = 0;
  *(undefined8 *)((long)__s + 0x238) = 0;
  *(undefined4 *)((long)__s + 0x240) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x248) = 0;
  *(undefined8 *)((long)__s + 0x250) = 0;
  *(long *)((long)__s + 600) = (long)__s + 0x288;
  *(undefined8 *)((long)__s + 0x260) = 1;
  *(undefined8 *)((long)__s + 0x268) = 0;
  *(undefined8 *)((long)__s + 0x270) = 0;
  *(undefined4 *)((long)__s + 0x278) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x280) = 0;
  *(undefined8 *)((long)__s + 0x288) = 0;
  *(long *)((long)__s + 0x290) = (long)__s + 0x2c0;
  *(undefined8 *)((long)__s + 0x298) = 1;
  *(undefined8 *)((long)__s + 0x2a0) = 0;
  *(undefined8 *)((long)__s + 0x2a8) = 0;
  *(undefined4 *)((long)__s + 0x2b0) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x2b8) = 0;
  *(undefined8 *)((long)__s + 0x2c0) = 0;
  *(long *)((long)__s + 0x2c8) = (long)__s + 0x2f8;
  *(undefined8 *)((long)__s + 0x2d0) = 1;
  *(undefined8 *)((long)__s + 0x2d8) = 0;
  *(undefined8 *)((long)__s + 0x2e0) = 0;
  *(undefined4 *)((long)__s + 0x2e8) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x2f0) = 0;
  *(undefined8 *)((long)__s + 0x2f8) = 0;
  *(long *)((long)__s + 0x300) = (long)__s + 0x330;
  *(undefined8 *)((long)__s + 0x308) = 1;
  *(undefined8 *)((long)__s + 0x310) = 0;
  *(undefined8 *)((long)__s + 0x318) = 0;
  *(undefined4 *)((long)__s + 800) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x328) = 0;
  *(undefined8 *)((long)__s + 0x330) = 0;
  *(long *)((long)__s + 0x338) = (long)__s + 0x368;
  *(undefined8 *)((long)__s + 0x340) = 1;
  *(undefined8 *)((long)__s + 0x348) = 0;
  *(undefined8 *)((long)__s + 0x350) = 0;
  *(undefined4 *)((long)__s + 0x358) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x360) = 0;
  *(undefined8 *)((long)__s + 0x368) = 0;
  *(void **)in_RDI.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
            super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
            super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl = __s;
  return (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
         (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
         in_RDI.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
         super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}